

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_328d25::t_debugger::f_print_value
          (t_debugger *this,t_pvalue *a_value,size_t a_depth)

{
  t_object *ptVar1;
  size_t sVar2;
  t_type_id *ppvVar3;
  undefined8 *puVar4;
  long *plVar5;
  t_object *ptVar6;
  ulong uVar7;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *paVar8;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *paVar9;
  undefined1 *puVar10;
  long lVar11;
  ulong uVar12;
  char *__format;
  FILE *pFVar13;
  int __c;
  char *pcVar14;
  size_t sVar15;
  t_type *ptVar16;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 aVar17;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 local_48;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 local_40;
  size_t local_38;
  
  ptVar1 = (a_value->super_t_pointer).v_p;
  pFVar13 = (FILE *)this->v_out;
  switch(ptVar1) {
  case (t_object *)0x0:
    pcVar14 = "null";
    break;
  case (t_object *)0x1:
    pcVar14 = "false";
    break;
  case (t_object *)0x2:
    pcVar14 = "true";
    break;
  case (t_object *)0x3:
    paVar9 = (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)ptVar1->v_data;
    if (ptVar1 < (t_object *)0x5) {
      paVar9 = &a_value->field_0;
    }
    pcVar14 = (char *)paVar9->v_integer;
    __format = "%ld";
LAB_0017d4db:
    fprintf(pFVar13,__format,pcVar14);
    return;
  case (t_object *)0x4:
    paVar9 = (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)ptVar1->v_data;
    if (ptVar1 < (t_object *)0x5) {
      paVar9 = &a_value->field_0;
    }
    fprintf(pFVar13,"%g",paVar9->v_integer);
    return;
  default:
    fprintf(pFVar13,"@%p");
    local_38 = a_depth - 1;
    if (local_38 != 0) {
      fputc(0x28,(FILE *)this->v_out);
      ptVar16 = ((a_value->super_t_pointer).v_p)->v_type;
      sVar15 = ptVar16->v_instance_fields;
      if (sVar15 != 0) {
        ptVar16 = ptVar16 + 1;
        lVar11 = 8;
        while( true ) {
          sVar15 = sVar15 - 1;
          fprintf((FILE *)this->v_out,"%ls: ",
                  *(undefined8 *)(*(long *)((ptVar16->v_this).v_p._M_b._M_p)->v_data + 0x20));
          ptVar1 = (a_value->super_t_pointer).v_p;
          sVar2 = ptVar1->v_type->v_fields_offset;
          local_48 = *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *)
                      (ptVar1->v_data + lVar11 + sVar2 + -0x50);
          local_40 = *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *)
                      (ptVar1->v_data + lVar11 + sVar2 + -0x48);
          f_print_value(this,(t_pvalue *)&local_48,local_38);
          if (sVar15 == 0) break;
          fputs(", ",(FILE *)this->v_out);
          lVar11 = lVar11 + 0x10;
          ptVar16 = (t_type *)&ptVar16->v_super;
        }
      }
      fputc(0x29,(FILE *)this->v_out);
    }
    ptVar1 = (a_value->super_t_pointer).v_p;
    sVar15 = ptVar1->v_type->v_depth;
    if (sVar15 != 0) {
      ppvVar3 = ptVar1->v_type->v_ids;
      puVar4 = (undefined8 *)ppvVar3[1];
      if (puVar4 == &xemmai::v__type_id<xemmai::t_string>) {
        pFVar13 = (FILE *)this->v_out;
        pcVar14 = ptVar1->v_data + 8;
        __format = " \"%ls\"";
        goto LAB_0017d4db;
      }
      if (puVar4 == &xemmai::v__type_id<xemmai::t_tuple>) {
        fputs(" \'(",(FILE *)this->v_out);
        sVar15 = local_38;
        if (local_38 == 0) {
          fputs("...",(FILE *)this->v_out);
        }
        else {
          ptVar1 = (a_value->super_t_pointer).v_p;
          if (*(long *)ptVar1->v_data != 0) {
            local_48 = *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *)
                        (ptVar1->v_data + 8);
            local_40 = *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *)
                        (ptVar1->v_data + 0x10);
            f_print_value(this,(t_pvalue *)&local_48,local_38);
            if (1 < *(ulong *)ptVar1->v_data) {
              paVar8 = (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *)
                       (ptVar1->v_data + 0x20);
              uVar12 = 1;
              do {
                fputs(", ",(FILE *)this->v_out);
                local_48 = paVar8[-1];
                local_40 = *paVar8;
                f_print_value(this,(t_pvalue *)&local_48,sVar15);
                uVar12 = uVar12 + 1;
                paVar8 = paVar8 + 2;
              } while (uVar12 < *(ulong *)ptVar1->v_data);
            }
          }
        }
        pFVar13 = (FILE *)this->v_out;
        __c = 0x29;
LAB_0017d750:
        fputc(__c,pFVar13);
        return;
      }
      if (sVar15 != 1) {
        puVar4 = (undefined8 *)ppvVar3[2];
        if (puVar4 == &xemmai::v__type_id<xemmai::t_list>) {
          fputs(" [",(FILE *)this->v_out);
          sVar15 = local_38;
          if (local_38 == 0) {
            fputs("...",(FILE *)this->v_out);
          }
          else {
            ptVar1 = (a_value->super_t_pointer).v_p;
            lVar11._0_1_ = ptVar1[1].v_color;
            lVar11._1_1_ = ptVar1[1].v_reviving;
            lVar11._2_6_ = *(undefined6 *)&ptVar1[1].field_0x1a;
            if (lVar11 != 0) {
              paVar8 = (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *)
                       xemmai::t_list::operator[]((t_list *)ptVar1->v_data,0);
              local_48 = *paVar8;
              local_40 = paVar8[1];
              f_print_value(this,(t_pvalue *)&local_48,sVar15);
              uVar12._0_1_ = ptVar1[1].v_color;
              uVar12._1_1_ = ptVar1[1].v_reviving;
              uVar12._2_6_ = *(undefined6 *)&ptVar1[1].field_0x1a;
              if (1 < uVar12) {
                aVar17.v_integer = 1;
                do {
                  fputs(", ",(FILE *)this->v_out);
                  local_48 = aVar17;
                  xemmai::t_list::f_validate((t_list *)ptVar1->v_data,&local_48.v_integer);
                  pcVar14 = (ptVar1[1].v_scan)->v_data + (local_48.v_integer - 0x48);
                  ptVar6 = ptVar1[1].v_previous;
                  puVar10 = *(undefined1 **)ptVar6->v_data;
                  if (pcVar14 < puVar10) {
                    puVar10 = (undefined1 *)0x0;
                  }
                  lVar11 = ((long)pcVar14 - (long)puVar10) * 0x10;
                  local_48 = *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *)
                              ((long)ptVar6 + lVar11 + 0x50);
                  local_40 = *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *)
                              ((long)ptVar6 + lVar11 + 0x58);
                  f_print_value(this,(t_pvalue *)&local_48,sVar15);
                  aVar17.v_integer = aVar17.v_integer + 1;
                  uVar7._0_1_ = ptVar1[1].v_color;
                  uVar7._1_1_ = ptVar1[1].v_reviving;
                  uVar7._2_6_ = *(undefined6 *)&ptVar1[1].field_0x1a;
                } while ((ulong)aVar17 < uVar7);
              }
            }
          }
          fputc(0x5d,(FILE *)this->v_out);
        }
        else if (puVar4 == &xemmai::v__type_id<xemmai::t_map>) {
          fputs(" {",(FILE *)this->v_out);
          if (local_38 == 0) {
            fputs("...",(FILE *)this->v_out);
          }
          else {
            plVar5 = *(long **)((ptVar1[1].v_previous)->v_data + 8);
            pcVar14 = (ptVar1[1].v_previous)->v_data + 0x20;
            do {
              if (*(long *)pcVar14 != 0) {
                do {
                  sVar15 = local_38;
                  local_48 = *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *)
                              (pcVar14 + 0x10);
                  local_40 = *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *)
                              (pcVar14 + 0x18);
                  f_print_value(this,(t_pvalue *)&local_48,local_38);
                  fputs(": ",(FILE *)this->v_out);
                  local_48 = *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *)
                              (pcVar14 + 0x20);
                  local_40 = *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *)
                              (pcVar14 + 0x28);
                  f_print_value(this,(t_pvalue *)&local_48,sVar15);
                  do {
                    pcVar14 = pcVar14 + 0x30;
                    if (plVar5 <= pcVar14) goto LAB_0017d887;
                  } while (*(long *)pcVar14 == 0);
                  fputs(", ",(FILE *)this->v_out);
                } while( true );
              }
              pcVar14 = pcVar14 + 0x30;
            } while (pcVar14 < plVar5);
          }
LAB_0017d887:
          pFVar13 = (FILE *)this->v_out;
          __c = 0x7d;
          goto LAB_0017d750;
        }
      }
    }
    return;
  }
  fputs(pcVar14,pFVar13);
  return;
}

Assistant:

void f_print_value(const t_pvalue& a_value, size_t a_depth)
	{
		switch (a_value.f_tag()) {
		case c_tag__NULL:
			std::fputs("null", v_out);
			break;
		case c_tag__FALSE:
			std::fputs("false", v_out);
			break;
		case c_tag__TRUE:
			std::fputs("true", v_out);
			break;
		case c_tag__INTEGER:
			std::fprintf(v_out, "%" PRIdPTR, f_as<intptr_t>(a_value));
			break;
		case c_tag__FLOAT:
			std::fprintf(v_out, "%g", f_as<double>(a_value));
			break;
		default:
			std::fprintf(v_out, "@%p", static_cast<t_object*>(a_value));
			if (--a_depth > 0) {
				std::fputc('(', v_out);
				auto type = a_value->f_type();
				auto n = type->v_instance_fields;
				if (n > 0) {
					size_t i = 0;
					while (true) {
						std::fprintf(v_out, "%ls: ", type->f_fields()[i].first->f_as<t_symbol>().f_string().c_str());
						f_print_value(a_value->f_fields()[i], a_depth);
						if (++i >= n) break;
						std::fputs(", ", v_out);
					}
				}
				std::fputc(')', v_out);
			}
			if (f_is<t_string>(a_value)) {
				std::fprintf(v_out, " \"%ls\"", static_cast<const wchar_t*>(a_value->f_as<t_string>()));
			} else if (f_is<t_tuple>(a_value)) {
				std::fputs(" '(", v_out);
				f_print_sequence<t_tuple>(a_value, a_depth);
				std::fputc(')', v_out);
			} else if (f_is<t_list>(a_value)) {
				std::fputs(" [", v_out);
				f_print_sequence<t_list>(a_value, a_depth);
				std::fputc(']', v_out);
			} else if (f_is<t_map>(a_value)) {
				auto& map = a_value->f_as<t_map>();
				std::fputs(" {", v_out);
				if (a_depth <= 0) {
					std::fputs("...", v_out);
				} else {
					t_map::t_iterator i(map);
					if (i.f_entry()) {
						while (true) {
							f_print_value(i.f_entry()->f_key(), a_depth);
							std::fputs(": ", v_out);
							f_print_value(i.f_entry()->v_value, a_depth);
							i.f_next();
							if (!i.f_entry()) break;
							std::fputs(", ", v_out);
						}
					}
				}
				std::fputc('}', v_out);
			}
		}
	}